

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry_&> __thiscall
kj::
Table<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Entry,kj::HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>>
::find<0ul,kj::ReadableDirectory_const*&>
          (Table<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Entry,kj::HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>>
           *this,ReadableDirectory **params)

{
  HashIndex<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Callbacks> *pHVar1;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar2;
  Entry *t;
  ArrayPtr<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> AVar3;
  Entry *local_50;
  ReadableDirectory **local_48;
  Maybe<unsigned_long> local_40;
  undefined1 local_30 [8];
  NullableValue<unsigned_long> pos;
  ReadableDirectory **params_local;
  Table<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry,_kj::HashIndex<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Callbacks>_>
  *this_local;
  
  pos.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)params;
  pHVar1 = get<0ul,kj::HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>&>
                     ((HashIndex<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Callbacks>
                       *)(this + 0x20));
  AVar3 = Vector<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry>::asPtr
                    ((Vector<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> *)this);
  fwd<kj::ReadableDirectory_const*&>((ReadableDirectory **)pos.field_1);
  local_50 = AVar3.ptr;
  local_48 = (ReadableDirectory **)AVar3.size_;
  AVar3.size_ = (size_t)local_50;
  AVar3.ptr = (Entry *)pHVar1;
  HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>::
  find<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Entry,kj::ReadableDirectory_const*&>
            ((HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks> *)&local_40
             ,AVar3,local_48);
  other = kj::_::readMaybe<unsigned_long>(&local_40);
  kj::_::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_30,other)
  ;
  Maybe<unsigned_long>::~Maybe(&local_40);
  puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_30);
  if (puVar2 == (unsigned_long *)0x0) {
    Maybe<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry_&>::Maybe
              ((Maybe<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry_&> *)&this_local
               ,(void *)0x0);
  }
  else {
    puVar2 = kj::_::NullableValue<unsigned_long>::operator*
                       ((NullableValue<unsigned_long> *)local_30);
    t = Vector<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry>::operator[]
                  ((Vector<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> *)this,
                   *puVar2);
    Maybe<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry_&>::Maybe
              ((Maybe<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry_&> *)&this_local
               ,t);
  }
  kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_30);
  return (Maybe<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry_&>)(Entry *)this_local
  ;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_MAYBE(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[*pos];
  } else {
    return nullptr;
  }
}